

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

bool __thiscall GGSock::Communicator::Data::update(Data *this)

{
  char cVar1;
  
  std::mutex::lock(&this->mutex);
  if (this->isServer == true) {
    if (this->isListening == true) {
      doListen(this);
      goto LAB_0010f387;
    }
    if ((this->isListening != false) || (this->isConnected == false)) goto LAB_0010f35e;
  }
  else {
LAB_0010f35e:
    if (this->isServer != false) goto LAB_0010f387;
    if (this->isConnecting == true) {
      doConnect(this);
      goto LAB_0010f387;
    }
    if ((this->isConnecting != false) || (this->isConnected != true)) goto LAB_0010f387;
  }
  doRead(this);
LAB_0010f387:
  std::mutex::lock(&this->mutexSend);
  cVar1 = this->isConnected;
  if (((bool)cVar1 == true) && (this->rbHead != this->rbEnd)) {
    doSend(this);
    cVar1 = this->isConnected;
  }
  if (cVar1 == '\0') {
    this->rbHead = this->rbEnd;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutexSend);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return true;
}

Assistant:

bool update() {
            std::lock_guard<std::mutex> lock(mutex);
            if (isServer && isListening) {
                doListen();
            } else if (isServer && isListening == false && isConnected) {
                doRead();
            } else if (isServer == false && isConnecting) {
                doConnect();
            } else if (isServer == false && isConnecting == false && isConnected) {
                doRead();
            }
            {
                std::lock_guard<std::mutex> lock(mutexSend);
                if (isConnected && (rbHead != rbEnd)) {
                    doSend();
                }
                if (isConnected == false) {
                    rbHead = rbEnd;
                }
            }

            return true;
        }